

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::yml::preprocess_rxmap(csubstr s,substr buf)

{
  csubstr s_00;
  csubstr s_01;
  csubstr s_02;
  csubstr s_03;
  Location loc;
  substr buf_;
  bool bVar1;
  error_flags eVar2;
  size_t in_RCX;
  char *in_RDX;
  basic_substring<const_char> *in_RSI;
  char *in_RDI;
  csubstr ss_1;
  csubstr ss;
  char next;
  char curr;
  size_t i;
  size_t last;
  _ppstate state;
  _SubstrWriter writer;
  int n_4;
  int n_3;
  int n_2;
  int n_1;
  int n;
  size_t in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  Location *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  basic_substring<const_char> *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  undefined6 in_stack_fffffffffffffc90;
  undefined6 uVar3;
  CC in_stack_fffffffffffffc96;
  undefined1 uVar4;
  CC in_stack_fffffffffffffc97;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  int local_360;
  undefined6 in_stack_fffffffffffffcb0;
  CC in_stack_fffffffffffffcb6;
  CC in_stack_fffffffffffffcb7;
  basic_substring<const_char> *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  undefined8 in_stack_fffffffffffffcc8;
  basic_substring<const_char> *pbVar6;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcdc;
  undefined1 in_stack_fffffffffffffcde;
  undefined1 in_stack_fffffffffffffcdf;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  char local_30a;
  basic_substring<char_const> local_2e0 [16];
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  basic_substring<const_char> local_2b0;
  basic_substring<char_const> local_2a0 [16];
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  basic_substring<const_char> local_270;
  char local_25a;
  char local_259;
  basic_substring<const_char> *local_258;
  char *local_250;
  basic_substring<const_char> *local_248;
  Location *pLStack_228;
  char *local_220;
  basic_substring<const_char> *local_218;
  int local_20c;
  _SubstrWriter local_1f8;
  basic_substring<const_char> local_1d0;
  basic_substring<const_char> *local_1c0;
  basic_substring<const_char> *local_1b8;
  char *local_1b0;
  undefined4 local_1a8;
  basic_substring<const_char> *local_1a0;
  basic_substring<const_char> *local_198;
  undefined8 local_190;
  undefined8 local_188;
  char *local_180;
  undefined4 local_178;
  basic_substring<const_char> *local_170;
  basic_substring<const_char> *local_168;
  undefined8 local_160;
  undefined8 local_158;
  char *local_150;
  undefined4 local_148;
  basic_substring<const_char> *local_140;
  basic_substring<const_char> *local_138;
  undefined8 local_130;
  undefined8 local_128;
  char *local_120;
  undefined4 local_118;
  char *local_110;
  undefined4 local_108;
  char *local_100;
  undefined4 local_f8;
  basic_substring<const_char> *local_f0;
  char *local_e8;
  basic_substring<const_char> *local_e0;
  char *local_d8;
  basic_substring<const_char> *local_d0;
  char *local_c8;
  undefined4 local_c0;
  char *local_b8;
  undefined4 local_b0;
  char *local_a8;
  undefined4 local_a0;
  basic_substring<const_char> *local_98;
  basic_substring<const_char> *local_90;
  basic_substring<const_char> *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined4 local_68;
  basic_substring<const_char> *local_60;
  basic_substring<const_char> *local_58;
  char *local_50;
  undefined4 local_48;
  basic_substring<const_char> *local_40;
  basic_substring<const_char> *local_38;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int local_20;
  undefined4 local_1c;
  int local_18;
  undefined4 local_14;
  int local_10;
  int local_c;
  int local_8;
  char local_1;
  
  buf_.len = in_RCX;
  buf_.str = in_RDX;
  local_1d0.str = in_RDI;
  local_1d0.len = (size_t)in_RSI;
  detail::_SubstrWriter::_SubstrWriter(&local_1f8,buf_,0);
  local_20c = 0;
  local_218 = (basic_substring<const_char> *)0x0;
  bVar1 = basic_substring<const_char>::begins_with(&local_1d0,'{');
  if (bVar1) {
    bVar1 = basic_substring<const_char>::ends_with(&local_1d0,'}');
    if (!bVar1) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      loc.super_LineCol.offset._7_1_ = in_stack_fffffffffffffcc7;
      loc.super_LineCol.offset._0_7_ = in_stack_fffffffffffffcc0;
      loc.super_LineCol.line = in_stack_fffffffffffffcc8;
      loc.super_LineCol.col._0_4_ = in_stack_fffffffffffffcd0;
      loc.super_LineCol.col._4_4_ = in_stack_fffffffffffffcd4;
      loc.name.str._0_4_ = in_stack_fffffffffffffcd8;
      loc.name.str._4_2_ = in_stack_fffffffffffffcdc;
      loc.name.str._6_1_ = in_stack_fffffffffffffcde;
      loc.name.str._7_1_ = in_stack_fffffffffffffcdf;
      loc.name.len._0_4_ = in_stack_fffffffffffffce0;
      loc.name.len._4_4_ = in_stack_fffffffffffffce4;
      error<31ul>((char (*) [31])
                  CONCAT17(in_stack_fffffffffffffcb7,
                           CONCAT16(in_stack_fffffffffffffcb6,in_stack_fffffffffffffcb0)),loc);
      in_stack_fffffffffffffc70 = pLStack_228;
      in_stack_fffffffffffffc78 = local_220;
    }
    local_e0 = &local_1d0;
    local_e8 = (char *)0x1;
    local_f0 = (basic_substring<const_char> *)0x1;
    if ((basic_substring<const_char> *)local_1d0.len == (basic_substring<const_char> *)0x0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_100 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f8 = 0x1560;
      handle_error(0x344e8b,(char *)0x1560,"check failed: %s","left >= 0 && left <= len");
    }
    if (local_1d0.len < local_f0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108 = 0x1561;
      handle_error(0x344e8b,(char *)0x1561,"check failed: %s","right >= 0 && right <= len");
    }
    if ((char *)(local_1d0.len + (1 - (long)local_f0)) < local_e8) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x1562;
      handle_error(0x344e8b,(char *)0x1562,"check failed: %s","left <= len - right + 1");
    }
    basic_substring<const_char>::basic_substring
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70
              );
    local_250 = local_d8;
    local_248 = local_d0;
    local_1d0.str = local_d8;
    local_1d0.len = (size_t)local_d0;
  }
  detail::_SubstrWriter::append(&local_1f8,'{');
  for (local_258 = (basic_substring<const_char> *)0x0; local_258 < local_1d0.len;
      local_258 = (basic_substring<const_char> *)((long)&local_258->str + 1)) {
    local_38 = &local_1d0;
    local_40 = local_258;
    if (local_1d0.len <= local_258) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_48 = 0x14c3;
      handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    local_259 = local_1d0.str[(long)local_40];
    if ((basic_substring<const_char> *)((long)&local_258->str + 1U) < local_1d0.len) {
      local_60 = (basic_substring<const_char> *)((long)&local_258->str + 1);
      local_58 = &local_1d0;
      if (local_1d0.len <= local_60) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_70 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_68 = 0x14c3;
        handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      local_30a = local_1d0.str[(long)local_60];
    }
    else {
      local_30a = '\0';
    }
    local_25a = local_30a;
    if ((local_259 == '\'') || (local_259 == '\"')) {
      local_138 = &local_1d0;
      local_140 = local_258;
      if (local_1d0.len < local_258) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_148 = 0x1533;
        handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (size_t)in_stack_fffffffffffffc70);
      local_280 = local_130;
      local_278 = local_128;
      local_270 = basic_substring<const_char>::pair_range_esc
                            ((basic_substring<const_char> *)
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                             in_stack_fffffffffffffc97,in_stack_fffffffffffffc96);
      local_1b8 = &local_270;
      local_258 = (basic_substring<const_char> *)
                  (local_270.str + (local_270.len - (long)local_1d0.str));
      local_8 = local_20c;
      local_c = local_20c + 1;
      local_20c = local_c;
      if (2 < local_c) {
        local_20c = 0;
      }
    }
    else if (local_20c == 0) {
      local_1 = local_259;
      if ((((local_259 < 'a') || (bVar1 = true, 'z' < local_259)) &&
          ((local_259 < 'A' || (bVar1 = true, 'Z' < local_259)))) &&
         ((((local_259 < '0' || (bVar1 = true, '9' < local_259)) && (bVar1 = true, local_259 != '_')
           ) && ((bVar1 = true, local_259 != '-' && (bVar1 = true, local_259 != '~')))))) {
        bVar1 = local_259 == '$';
      }
      if (bVar1) {
        local_10 = local_20c;
        local_14 = 1;
        local_20c = 1;
      }
    }
    if (local_20c == 1) {
      if ((local_259 == ':') && (local_25a == ' ')) {
        local_18 = local_20c;
        local_1c = 2;
        local_20c = 2;
      }
      else if ((local_259 == ',') && (local_25a == ' ')) {
        pbVar6 = &local_1d0;
        local_90 = local_218;
        local_98 = local_258;
        local_88 = pbVar6;
        if (local_1d0.len < local_218) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_a0 = 0x1544;
          handle_error(0x344e8b,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        in_stack_fffffffffffffcb8 = local_98;
        if (local_98 == (basic_substring<const_char> *)0xffffffffffffffff) {
          in_stack_fffffffffffffcb8 = (basic_substring<const_char> *)pbVar6->len;
        }
        local_98 = in_stack_fffffffffffffcb8;
        if (in_stack_fffffffffffffcb8 < local_90) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffcb7 = is_debugger_attached(), (bool)in_stack_fffffffffffffcb7))
          {
            trap_instruction();
          }
          local_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b0 = 0x1546;
          handle_error(0x344e8b,(char *)0x1546,"check failed: %s","first <= last");
        }
        if ((basic_substring<const_char> *)pbVar6->len < local_98) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffcb6 = is_debugger_attached(), (bool)in_stack_fffffffffffffcb6))
          {
            trap_instruction();
          }
          local_c8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_c0 = 0x1547;
          handle_error(0x344e8b,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (size_t)in_stack_fffffffffffffc70);
        local_290 = local_80;
        local_288 = local_78;
        s_00.str._6_1_ = in_stack_fffffffffffffc96;
        s_00.str._0_6_ = in_stack_fffffffffffffc90;
        s_00.str._7_1_ = in_stack_fffffffffffffc97;
        s_00.len._0_4_ = in_stack_fffffffffffffc98;
        s_00.len._4_4_ = in_stack_fffffffffffffc9c;
        detail::_SubstrWriter::append
                  ((_SubstrWriter *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                   s_00);
        basic_substring<char_const>::basic_substring<6ul>(local_2a0,(char (*) [6])": 1, ");
        s_01.str._6_1_ = in_stack_fffffffffffffc96;
        s_01.str._0_6_ = in_stack_fffffffffffffc90;
        s_01.str._7_1_ = in_stack_fffffffffffffc97;
        s_01.len._0_4_ = in_stack_fffffffffffffc98;
        s_01.len._4_4_ = in_stack_fffffffffffffc9c;
        detail::_SubstrWriter::append
                  ((_SubstrWriter *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                   s_01);
        local_218 = (basic_substring<const_char> *)((long)&local_258->str + 2);
      }
    }
    else if (local_20c == 2) {
      if (((local_259 == '[') || (local_259 == '{')) || (local_259 == '(')) {
        local_168 = &local_1d0;
        local_170 = local_258;
        if (local_1d0.len < local_258) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_180 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_178 = 0x1533;
          handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (size_t)in_stack_fffffffffffffc70);
        local_2c0 = local_160;
        local_2b8 = local_158;
        local_2b0 = basic_substring<const_char>::pair_range_nested
                              (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb7,
                               in_stack_fffffffffffffcb6);
        local_1c0 = &local_2b0;
        local_258 = (basic_substring<const_char> *)
                    (local_2b0.str + (local_2b0.len - (long)local_1d0.str));
        local_20 = local_20c;
        local_24 = local_20c + 1;
        local_360 = local_24;
        if (2 < local_24) {
          local_360 = 0;
        }
        local_20c = local_360;
      }
      else if ((local_259 == ',') && (local_25a == ' ')) {
        local_28 = local_20c;
        local_2c = 3;
        in_stack_fffffffffffffc9c = 0;
        local_20c = in_stack_fffffffffffffc9c;
      }
    }
  }
  local_198 = &local_1d0;
  local_1a0 = local_218;
  uVar3 = SUB86(local_198,0);
  uVar4 = (undefined1)((ulong)local_198 >> 0x30);
  uVar5 = (undefined1)((ulong)local_198 >> 0x38);
  if (local_1d0.len < local_218) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) &&
       (in_stack_fffffffffffffc8f = is_debugger_attached(), (bool)in_stack_fffffffffffffc8f)) {
      trap_instruction();
    }
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_1a8 = 0x1533;
    handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
  local_2d0 = local_190;
  local_2c8 = local_188;
  s_02.str._6_1_ = uVar4;
  s_02.str._0_6_ = uVar3;
  s_02.str._7_1_ = uVar5;
  s_02.len._0_4_ = in_stack_fffffffffffffc98;
  s_02.len._4_4_ = in_stack_fffffffffffffc9c;
  detail::_SubstrWriter::append
            ((_SubstrWriter *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),s_02);
  if (local_20c == 1) {
    basic_substring<char_const>::basic_substring<4ul>(local_2e0,(char (*) [4])": 1");
    s_03.str._6_1_ = uVar4;
    s_03.str._0_6_ = uVar3;
    s_03.str._7_1_ = uVar5;
    s_03.len._0_4_ = in_stack_fffffffffffffc98;
    s_03.len._4_4_ = in_stack_fffffffffffffc9c;
    detail::_SubstrWriter::append
              ((_SubstrWriter *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),s_03);
  }
  detail::_SubstrWriter::append(&local_1f8,'}');
  return local_1f8.pos;
}

Assistant:

size_t preprocess_rxmap(csubstr s, substr buf)
{
    detail::_SubstrWriter writer(buf);
    _ppstate state = kReadPending;
    size_t last = 0;

    if(s.begins_with('{'))
    {
        RYML_CHECK(s.ends_with('}'));
        s = s.offs(1, 1);
    }

    writer.append('{');

    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s[i];
        const char next = i+1 < s.len ? s[i+1] : '\0';

        if(curr == '\'' || curr == '"')
        {
            csubstr ss = s.sub(i).pair_range_esc(curr, '\\');
            i += static_cast<size_t>(ss.end() - (s.str + i));
            state = _next(state);
        }
        else if(state == kReadPending && _is_idchar(curr))
        {
            state = _next(state);
        }

        switch(state)
        {
        case kKeyPending:
        {
            if(curr == ':' && next == ' ')
            {
                state = _next(state);
            }
            else if(curr == ',' && next == ' ')
            {
                writer.append(s.range(last, i));
                writer.append(": 1, ");
                last = i + 2;
            }
            break;
        }
        case kValPending:
        {
            if(curr == '[' || curr == '{' || curr == '(')
            {
                csubstr ss = s.sub(i).pair_range_nested(curr, '\\');
                i += static_cast<size_t>(ss.end() - (s.str + i));
                state = _next(state);
            }
            else if(curr == ',' && next == ' ')
            {
                state = _next(state);
            }
            break;
        }
        default:
            // nothing to do
            break;
        }
    }

    writer.append(s.sub(last));
    if(state == kKeyPending)
        writer.append(": 1");
    writer.append('}');

    return writer.pos;
}